

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
LinkedReadsDatastore::get_tag_reads
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          LinkedReadsDatastore *this,LinkedTag tag)

{
  uint *puVar1;
  iterator iVar2;
  uint *puVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long uVar7;
  unsigned_long local_30;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(__return_storage_ptr__,10000);
  puVar1 = (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = puVar1;
  uVar6 = (long)(this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  while (puVar3 = puVar4, 0 < (long)uVar6) {
    uVar5 = uVar6 >> 1;
    uVar6 = ~uVar5 + uVar6;
    puVar4 = puVar3 + uVar5 + 1;
    if (tag <= puVar3[uVar5]) {
      puVar4 = puVar3;
      uVar6 = uVar5;
    }
  }
  if (*(LinkedTag *)
       ((long)(this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start + ((long)puVar3 - (long)puVar1)) == tag) {
    local_30 = (long)puVar3 - (long)puVar1 >> 1;
    do {
      uVar7 = local_30 + 2;
      local_30 = local_30 + 1;
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<long>
                  (__return_storage_ptr__,iVar2,(long *)&local_30);
      }
      else {
        *iVar2._M_current = local_30;
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_30 = uVar7;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<long>
                  (__return_storage_ptr__,iVar2,(long *)&local_30);
      }
      else {
        *iVar2._M_current = uVar7;
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_30 = uVar7;
    } while (*(LinkedTag *)
              ((long)(this->read_tag).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar7 * 2) == tag);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint64_t> LinkedReadsDatastore::get_tag_reads(LinkedTag tag) const {
    std::vector<uint64_t> rids;
    rids.reserve(10000);
    for (auto n=std::lower_bound(read_tag.begin(),read_tag.end(),tag)-read_tag.begin();read_tag[n]==tag;++n) {
        rids.emplace_back( n * 2 + 1);
        rids.emplace_back( n * 2 + 2);
    }
    return rids;
}